

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O3

Err * __thiscall
wasm::WATParser::Lexer::err(Err *__return_storage_ptr__,Lexer *this,size_t pos,string *reason)

{
  ostream *poVar1;
  stringstream local_1c0 [8];
  stringstream msg;
  ostream local_1b0 [112];
  ios_base local_140 [264];
  TextPos local_38;
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  if ((this->file).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1b0,
                        (this->file).
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p,
                        (this->file).
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  }
  local_38 = position(this,(this->buffer)._M_str + pos);
  poVar1 = WATParser::operator<<(local_1b0,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": error: ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(reason->_M_dataplus)._M_p,reason->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::ios_base::~ios_base(local_140);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Err err(size_t pos, std::string reason) {
    std::stringstream msg;
    if (file) {
      msg << *file << ":";
    }
    msg << position(pos) << ": error: " << reason;
    return Err{msg.str()};
  }